

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

void __thiscall
spvtools::val::ValidationState_t::RegisterStorageClassConsumer
          (ValidationState_t *this,StorageClass storage_class,Instruction *consumer)

{
  size_t *psVar1;
  bool bVar2;
  Function *pFVar3;
  _Node *p_Var4;
  code *pcVar5;
  char *in_RCX;
  uint *puVar6;
  _Any_data *p_Var7;
  string errorVUID;
  undefined1 *local_1b8;
  char *local_1b0;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  long lStack_1a0;
  string local_198;
  _Any_data local_178;
  code *local_168;
  code *pcStack_160;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  bVar2 = spvIsVulkanEnv(this->context_->target_env);
  if (bVar2) {
    if ((int)storage_class < 0x14da) {
      if (0x14cf < (int)storage_class) goto LAB_001fcc5f;
      if (storage_class != Output) {
        if (storage_class != StorageClassWorkgroup) {
          return;
        }
        VkErrorID_abi_cxx11_(&local_198,this,0x1225,in_RCX);
        pFVar3 = function(this,consumer->function_->id_);
        local_1b8 = &local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_198._M_dataplus._M_p,
                   local_198._M_dataplus._M_p + local_198._M_string_length);
        local_a8 = (code *)0x0;
        pcStack_a0 = (code *)0x0;
        local_b8._M_unused._M_object = (void *)0x0;
        local_b8._8_8_ = 0;
        local_b8._M_unused._M_object = operator_new(0x20);
        in_RCX = local_1b0;
        *(code **)local_b8._M_unused._0_8_ = (code *)((long)local_b8._M_unused._0_8_ + 0x10);
        if (local_1b8 == &local_1a8) {
          *(long *)((long)local_b8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
          *(long *)((long)local_b8._M_unused._0_8_ + 0x18) = lStack_1a0;
        }
        else {
          *(undefined1 **)local_b8._M_unused._0_8_ = local_1b8;
          *(long *)((long)local_b8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
        }
        *(char **)((long)local_b8._M_unused._0_8_ + 8) = local_1b0;
        local_1b0 = (char *)0x0;
        local_1a8 = 0;
        pcStack_a0 = std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:662:46)>
                     ::_M_invoke;
        local_a8 = std::
                   _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:662:46)>
                   ::_M_manager;
        local_1b8 = &local_1a8;
        p_Var4 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)&pFVar3->execution_model_limitations_,
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_b8);
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        psVar1 = &(pFVar3->execution_model_limitations_).
                  super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_a8 != (code *)0x0) {
          (*local_a8)(&local_b8,&local_b8,__destroy_functor);
        }
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001fcbac;
      }
      VkErrorID_abi_cxx11_(&local_198,this,0x1224,in_RCX);
      pFVar3 = function(this,consumer->function_->id_);
      local_1b8 = &local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,local_198._M_dataplus._M_p,
                 local_198._M_dataplus._M_p + local_198._M_string_length);
      local_88 = (code *)0x0;
      pcStack_80 = (code *)0x0;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_98._M_unused._M_object = operator_new(0x20);
      *(code **)local_98._M_unused._0_8_ = (code *)((long)local_98._M_unused._0_8_ + 0x10);
      if (local_1b8 == &local_1a8) {
        *(long *)((long)local_98._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
        *(long *)((long)local_98._M_unused._0_8_ + 0x18) = lStack_1a0;
      }
      else {
        *(undefined1 **)local_98._M_unused._0_8_ = local_1b8;
        *(long *)((long)local_98._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
      }
      *(char **)((long)local_98._M_unused._0_8_ + 8) = local_1b0;
      local_1b0 = (char *)0x0;
      local_1a8 = 0;
      pcStack_80 = std::
                   _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:635:46)>
                   ::_M_invoke;
      local_88 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:635:46)>
                 ::_M_manager;
      local_1b8 = &local_1a8;
      p_Var4 = std::__cxx11::
               list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
               ::
               _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                         ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                           *)&pFVar3->execution_model_limitations_,
                          (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                           *)&local_98);
      std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
      psVar1 = &(pFVar3->execution_model_limitations_).
                super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_88 != (code *)0x0) {
        p_Var7 = &local_98;
        pcVar5 = local_88;
        goto LAB_001fd3a2;
      }
    }
    else {
      puVar6 = &switchD_001fc9bf::switchdataD_003d9d10;
      switch(storage_class) {
      case RayPayloadKHR:
        goto switchD_001fc9bf_caseD_14da;
      case HitAttributeKHR:
switchD_001fc9bf_caseD_14db:
        VkErrorID_abi_cxx11_(&local_198,this,0x125d,(char *)puVar6);
        pFVar3 = function(this,consumer->function_->id_);
        local_1b8 = &local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_198._M_dataplus._M_p,
                   local_198._M_dataplus._M_p + local_198._M_string_length);
        local_128 = (code *)0x0;
        pcStack_120 = (code *)0x0;
        local_138._M_unused._M_object = (void *)0x0;
        local_138._8_8_ = 0;
        local_138._M_unused._M_object = operator_new(0x20);
        *(code **)local_138._M_unused._0_8_ = (code *)((long)local_138._M_unused._0_8_ + 0x10);
        if (local_1b8 == &local_1a8) {
          *(long *)((long)local_138._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
          *(long *)((long)local_138._M_unused._0_8_ + 0x18) = lStack_1a0;
        }
        else {
          *(undefined1 **)local_138._M_unused._0_8_ = local_1b8;
          *(long *)((long)local_138._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
        }
        *(char **)((long)local_138._M_unused._0_8_ + 8) = local_1b0;
        local_1b0 = (char *)0x0;
        local_1a8 = 0;
        pcStack_120 = std::
                      _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:742:13)>
                      ::_M_invoke;
        local_128 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:742:13)>
                    ::_M_manager;
        local_1b8 = &local_1a8;
        p_Var4 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)&pFVar3->execution_model_limitations_,
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_138);
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        psVar1 = &(pFVar3->execution_model_limitations_).
                  super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_128 != (code *)0x0) {
          p_Var7 = &local_138;
          pcVar5 = local_128;
LAB_001fd3a2:
          (*pcVar5)(p_Var7,p_Var7,__destroy_functor);
        }
        break;
      case CallableDataKHR|StorageBuffer:
      case CallableDataKHR|StorageBuffer|Input:
        goto switchD_001fc9bf_caseD_14dc;
      case IncomingRayPayloadKHR:
switchD_001fc9bf_caseD_14de:
        VkErrorID_abi_cxx11_(&local_198,this,0x125b,(char *)puVar6);
        pFVar3 = function(this,consumer->function_->id_);
        local_1b8 = &local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_198._M_dataplus._M_p,
                   local_198._M_dataplus._M_p + local_198._M_string_length);
        local_148 = (code *)0x0;
        pcStack_140 = (code *)0x0;
        local_158._M_unused._M_object = (void *)0x0;
        local_158._8_8_ = 0;
        local_158._M_unused._M_object = operator_new(0x20);
        *(code **)local_158._M_unused._0_8_ = (code *)((long)local_158._M_unused._0_8_ + 0x10);
        if (local_1b8 == &local_1a8) {
          *(long *)((long)local_158._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
          *(long *)((long)local_158._M_unused._0_8_ + 0x18) = lStack_1a0;
        }
        else {
          *(undefined1 **)local_158._M_unused._0_8_ = local_1b8;
          *(long *)((long)local_158._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
        }
        *(char **)((long)local_158._M_unused._0_8_ + 8) = local_1b0;
        local_1b0 = (char *)0x0;
        local_1a8 = 0;
        pcStack_140 = std::
                      _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:760:13)>
                      ::_M_invoke;
        local_148 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:760:13)>
                    ::_M_manager;
        local_1b8 = &local_1a8;
        p_Var4 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)&pFVar3->execution_model_limitations_,
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_158);
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        psVar1 = &(pFVar3->execution_model_limitations_).
                  super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_148 != (code *)0x0) {
          p_Var7 = &local_158;
          pcVar5 = local_148;
          goto LAB_001fd3a2;
        }
        break;
      case ShaderRecordBufferKHR:
switchD_001fc9bf_caseD_14df:
        VkErrorID_abi_cxx11_(&local_198,this,0x1bcf,(char *)puVar6);
        pFVar3 = function(this,consumer->function_->id_);
        local_1b8 = &local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_198._M_dataplus._M_p,
                   local_198._M_dataplus._M_p + local_198._M_string_length);
        local_168 = (code *)0x0;
        pcStack_160 = (code *)0x0;
        local_178._M_unused._M_object = (void *)0x0;
        local_178._8_8_ = 0;
        local_178._M_unused._M_object = operator_new(0x20);
        *(code **)local_178._M_unused._0_8_ = (code *)((long)local_178._M_unused._0_8_ + 0x10);
        if (local_1b8 == &local_1a8) {
          *(long *)((long)local_178._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
          *(long *)((long)local_178._M_unused._0_8_ + 0x18) = lStack_1a0;
        }
        else {
          *(undefined1 **)local_178._M_unused._0_8_ = local_1b8;
          *(long *)((long)local_178._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
        }
        *(char **)((long)local_178._M_unused._0_8_ + 8) = local_1b0;
        local_1b0 = (char *)0x0;
        local_1a8 = 0;
        pcStack_160 = std::
                      _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:778:13)>
                      ::_M_invoke;
        local_168 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:778:13)>
                    ::_M_manager;
        local_1b8 = &local_1a8;
        p_Var4 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)&pFVar3->execution_model_limitations_,
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_178);
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        psVar1 = &(pFVar3->execution_model_limitations_).
                  super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_168 != (code *)0x0) {
          p_Var7 = &local_178;
          pcVar5 = local_168;
          goto LAB_001fd3a2;
        }
        break;
      default:
switchD_001fc9bf_default:
        if (storage_class == HitObjectAttributeNV) {
          pFVar3 = function(this,consumer->function_->id_);
          local_78._M_unused._M_object = (void *)0x0;
          local_78._8_8_ = 0;
          local_60 = std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:813:44)>
                     ::_M_invoke;
          local_68 = std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:813:44)>
                     ::_M_manager;
          p_Var4 = std::__cxx11::
                   list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                   ::
                   _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                             ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                               *)&pFVar3->execution_model_limitations_,
                              (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                               *)&local_78);
          std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
          psVar1 = &(pFVar3->execution_model_limitations_).
                    super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if (local_68 == (code *)0x0) {
            return;
          }
          p_Var7 = &local_78;
          pcVar5 = local_68;
        }
        else {
          if (storage_class != StorageClassTaskPayloadWorkgroupEXT) {
            return;
          }
          pFVar3 = function(this,consumer->function_->id_);
          local_58._M_unused._M_object = (void *)0x0;
          local_58._8_8_ = 0;
          local_40 = std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:799:13)>
                     ::_M_invoke;
          local_48 = std::
                     _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:799:13)>
                     ::_M_manager;
          p_Var4 = std::__cxx11::
                   list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                   ::
                   _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                             ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                               *)&pFVar3->execution_model_limitations_,
                              (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                               *)&local_58);
          std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
          psVar1 = &(pFVar3->execution_model_limitations_).
                    super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if (local_48 == (code *)0x0) {
            return;
          }
          p_Var7 = &local_58;
          pcVar5 = local_48;
        }
        (*pcVar5)(p_Var7,p_Var7,__destroy_functor);
        goto switchD_001fc9bf_caseD_14dc;
      }
    }
  }
  else {
LAB_001fcbac:
    if (0x14d9 < (int)storage_class) {
      puVar6 = &switchD_001fcbd7::switchdataD_003d9d28;
      switch(storage_class) {
      case RayPayloadKHR:
        goto switchD_001fc9bf_caseD_14da;
      case HitAttributeKHR:
        goto switchD_001fc9bf_caseD_14db;
      case CallableDataKHR|StorageBuffer:
      case CallableDataKHR|StorageBuffer|Input:
        goto switchD_001fc9bf_caseD_14dc;
      case IncomingRayPayloadKHR:
        goto switchD_001fc9bf_caseD_14de;
      case ShaderRecordBufferKHR:
        goto switchD_001fc9bf_caseD_14df;
      default:
        goto switchD_001fc9bf_default;
      }
    }
LAB_001fcc5f:
    if (storage_class == CallableDataKHR) {
      VkErrorID_abi_cxx11_(&local_198,this,0x1260,in_RCX);
      pFVar3 = function(this,consumer->function_->id_);
      local_1b8 = &local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,local_198._M_dataplus._M_p,
                 local_198._M_dataplus._M_p + local_198._M_string_length);
      local_c8 = (code *)0x0;
      pcStack_c0 = (code *)0x0;
      local_d8._M_unused._M_object = (void *)0x0;
      local_d8._8_8_ = 0;
      local_d8._M_unused._M_object = operator_new(0x20);
      *(code **)local_d8._M_unused._0_8_ = (code *)((long)local_d8._M_unused._0_8_ + 0x10);
      if (local_1b8 == &local_1a8) {
        *(long *)((long)local_d8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
        *(long *)((long)local_d8._M_unused._0_8_ + 0x18) = lStack_1a0;
      }
      else {
        *(undefined1 **)local_d8._M_unused._0_8_ = local_1b8;
        *(long *)((long)local_d8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
      }
      *(char **)((long)local_d8._M_unused._0_8_ + 8) = local_1b0;
      local_1b0 = (char *)0x0;
      local_1a8 = 0;
      pcStack_c0 = std::
                   _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:687:13)>
                   ::_M_invoke;
      local_c8 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:687:13)>
                 ::_M_manager;
      local_1b8 = &local_1a8;
      p_Var4 = std::__cxx11::
               list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
               ::
               _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                         ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                           *)&pFVar3->execution_model_limitations_,
                          (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                           *)&local_d8);
      std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
      psVar1 = &(pFVar3->execution_model_limitations_).
                super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_c8 != (code *)0x0) {
        p_Var7 = &local_d8;
        pcVar5 = local_c8;
        goto LAB_001fd3a2;
      }
    }
    else {
      if (storage_class != IncomingCallableDataKHR) {
        return;
      }
      VkErrorID_abi_cxx11_(&local_198,this,0x1261,in_RCX);
      pFVar3 = function(this,consumer->function_->id_);
      local_1b8 = &local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,local_198._M_dataplus._M_p,
                 local_198._M_dataplus._M_p + local_198._M_string_length);
      local_e8 = (code *)0x0;
      pcStack_e0 = (code *)0x0;
      local_f8._M_unused._M_object = (void *)0x0;
      local_f8._8_8_ = 0;
      local_f8._M_unused._M_object = operator_new(0x20);
      *(code **)local_f8._M_unused._0_8_ = (code *)((long)local_f8._M_unused._0_8_ + 0x10);
      if (local_1b8 == &local_1a8) {
        *(long *)((long)local_f8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
        *(long *)((long)local_f8._M_unused._0_8_ + 0x18) = lStack_1a0;
      }
      else {
        *(undefined1 **)local_f8._M_unused._0_8_ = local_1b8;
        *(long *)((long)local_f8._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
      }
      *(char **)((long)local_f8._M_unused._0_8_ + 8) = local_1b0;
      local_1b0 = (char *)0x0;
      local_1a8 = 0;
      pcStack_e0 = std::
                   _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:707:13)>
                   ::_M_invoke;
      local_e8 = std::
                 _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:707:13)>
                 ::_M_manager;
      local_1b8 = &local_1a8;
      p_Var4 = std::__cxx11::
               list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
               ::
               _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                         ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                           *)&pFVar3->execution_model_limitations_,
                          (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                           *)&local_f8);
      std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
      psVar1 = &(pFVar3->execution_model_limitations_).
                super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_e8 != (code *)0x0) {
        p_Var7 = &local_f8;
        pcVar5 = local_e8;
        goto LAB_001fd3a2;
      }
    }
  }
LAB_001fd3ac:
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
switchD_001fc9bf_caseD_14dc:
  return;
switchD_001fc9bf_caseD_14da:
  VkErrorID_abi_cxx11_(&local_198,this,0x125a,(char *)puVar6);
  pFVar3 = function(this,consumer->function_->id_);
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_198._M_dataplus._M_p,
             local_198._M_dataplus._M_p + local_198._M_string_length);
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_118._M_unused._M_object = operator_new(0x20);
  *(code **)local_118._M_unused._0_8_ = (code *)((long)local_118._M_unused._0_8_ + 0x10);
  if (local_1b8 == &local_1a8) {
    *(long *)((long)local_118._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
    *(long *)((long)local_118._M_unused._0_8_ + 0x18) = lStack_1a0;
  }
  else {
    *(undefined1 **)local_118._M_unused._0_8_ = local_1b8;
    *(long *)((long)local_118._M_unused._0_8_ + 0x10) = CONCAT71(uStack_1a7,local_1a8);
  }
  *(char **)((long)local_118._M_unused._0_8_ + 8) = local_1b0;
  local_1b0 = (char *)0x0;
  local_1a8 = 0;
  pcStack_100 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:722:44)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:722:44)>
              ::_M_manager;
  local_1b8 = &local_1a8;
  p_Var4 = std::__cxx11::
           list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
           ::_M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                     ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                       *)&pFVar3->execution_model_limitations_,
                      (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                       *)&local_118);
  std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
  psVar1 = &(pFVar3->execution_model_limitations_).
            super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_108 != (code *)0x0) {
    p_Var7 = &local_118;
    pcVar5 = local_108;
    goto LAB_001fd3a2;
  }
  goto LAB_001fd3ac;
}

Assistant:

void ValidationState_t::RegisterStorageClassConsumer(
    spv::StorageClass storage_class, Instruction* consumer) {
  if (spvIsVulkanEnv(context()->target_env)) {
    if (storage_class == spv::StorageClass::Output) {
      std::string errorVUID = VkErrorID(4644);
      function(consumer->function()->id())
          ->RegisterExecutionModelLimitation([errorVUID](
                                                 spv::ExecutionModel model,
                                                 std::string* message) {
            if (model == spv::ExecutionModel::GLCompute ||
                model == spv::ExecutionModel::RayGenerationKHR ||
                model == spv::ExecutionModel::IntersectionKHR ||
                model == spv::ExecutionModel::AnyHitKHR ||
                model == spv::ExecutionModel::ClosestHitKHR ||
                model == spv::ExecutionModel::MissKHR ||
                model == spv::ExecutionModel::CallableKHR) {
              if (message) {
                *message =
                    errorVUID +
                    "in Vulkan environment, Output Storage Class must not be "
                    "used in GLCompute, RayGenerationKHR, IntersectionKHR, "
                    "AnyHitKHR, ClosestHitKHR, MissKHR, or CallableKHR "
                    "execution models";
              }
              return false;
            }
            return true;
          });
    }

    if (storage_class == spv::StorageClass::Workgroup) {
      std::string errorVUID = VkErrorID(4645);
      function(consumer->function()->id())
          ->RegisterExecutionModelLimitation([errorVUID](
                                                 spv::ExecutionModel model,
                                                 std::string* message) {
            if (model != spv::ExecutionModel::GLCompute &&
                model != spv::ExecutionModel::TaskNV &&
                model != spv::ExecutionModel::MeshNV &&
                model != spv::ExecutionModel::TaskEXT &&
                model != spv::ExecutionModel::MeshEXT) {
              if (message) {
                *message =
                    errorVUID +
                    "in Vulkan environment, Workgroup Storage Class is limited "
                    "to MeshNV, TaskNV, and GLCompute execution model";
              }
              return false;
            }
            return true;
          });
    }
  }

  if (storage_class == spv::StorageClass::CallableDataKHR) {
    std::string errorVUID = VkErrorID(4704);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::RayGenerationKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::CallableKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "CallableDataKHR Storage Class is limited to "
                      "RayGenerationKHR, ClosestHitKHR, CallableKHR, and "
                      "MissKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::IncomingCallableDataKHR) {
    std::string errorVUID = VkErrorID(4705);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::CallableKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "IncomingCallableDataKHR Storage Class is limited to "
                      "CallableKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::RayPayloadKHR) {
    std::string errorVUID = VkErrorID(4698);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation([errorVUID](
                                               spv::ExecutionModel model,
                                               std::string* message) {
          if (model != spv::ExecutionModel::RayGenerationKHR &&
              model != spv::ExecutionModel::ClosestHitKHR &&
              model != spv::ExecutionModel::MissKHR) {
            if (message) {
              *message =
                  errorVUID +
                  "RayPayloadKHR Storage Class is limited to RayGenerationKHR, "
                  "ClosestHitKHR, and MissKHR execution model";
            }
            return false;
          }
          return true;
        });
  } else if (storage_class == spv::StorageClass::HitAttributeKHR) {
    std::string errorVUID = VkErrorID(4701);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::IntersectionKHR &&
                  model != spv::ExecutionModel::AnyHitKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR) {
                if (message) {
                  *message = errorVUID +
                             "HitAttributeKHR Storage Class is limited to "
                             "IntersectionKHR, AnyHitKHR, sand ClosestHitKHR "
                             "execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::IncomingRayPayloadKHR) {
    std::string errorVUID = VkErrorID(4699);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::AnyHitKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "IncomingRayPayloadKHR Storage Class is limited to "
                      "AnyHitKHR, ClosestHitKHR, and MissKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::ShaderRecordBufferKHR) {
    std::string errorVUID = VkErrorID(7119);
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [errorVUID](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::RayGenerationKHR &&
                  model != spv::ExecutionModel::IntersectionKHR &&
                  model != spv::ExecutionModel::AnyHitKHR &&
                  model != spv::ExecutionModel::ClosestHitKHR &&
                  model != spv::ExecutionModel::CallableKHR &&
                  model != spv::ExecutionModel::MissKHR) {
                if (message) {
                  *message =
                      errorVUID +
                      "ShaderRecordBufferKHR Storage Class is limited to "
                      "RayGenerationKHR, IntersectionKHR, AnyHitKHR, "
                      "ClosestHitKHR, CallableKHR, and MissKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::TaskPayloadWorkgroupEXT) {
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation(
            [](spv::ExecutionModel model, std::string* message) {
              if (model != spv::ExecutionModel::TaskEXT &&
                  model != spv::ExecutionModel::MeshEXT) {
                if (message) {
                  *message =
                      "TaskPayloadWorkgroupEXT Storage Class is limited to "
                      "TaskEXT and MeshKHR execution model";
                }
                return false;
              }
              return true;
            });
  } else if (storage_class == spv::StorageClass::HitObjectAttributeNV) {
    function(consumer->function()->id())
        ->RegisterExecutionModelLimitation([](spv::ExecutionModel model,
                                              std::string* message) {
          if (model != spv::ExecutionModel::RayGenerationKHR &&
              model != spv::ExecutionModel::ClosestHitKHR &&
              model != spv::ExecutionModel::MissKHR) {
            if (message) {
              *message =
                  "HitObjectAttributeNV Storage Class is limited to "
                  "RayGenerationKHR, ClosestHitKHR or MissKHR execution model";
            }
            return false;
          }
          return true;
        });
  }
}